

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPostDepthCoverageTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::PostDepthSampleMaskCase::iterate(PostDepthSampleMaskCase *this)

{
  string *vertexSrc;
  GLboolean *pGVar1;
  GLboolean *pGVar2;
  GLuint program;
  glUniform1iFunc p_Var3;
  GLboolean GVar4;
  int iVar5;
  GLenum GVar6;
  GLint GVar7;
  undefined4 extraout_var;
  ShaderProgram *pSVar8;
  GLubyte *pGVar9;
  int i_1;
  GLenum GVar10;
  int n;
  long lVar11;
  int iVar12;
  char *pcVar13;
  GLint i;
  long lVar14;
  bool bVar15;
  GLboolean compiledMask [4];
  GLboolean expectedMask [4];
  GLuint indicesPre [3];
  GLubyte pixels [16];
  GLfloat texCoord [8];
  GLuint indicesPost [6];
  GLfloat verticesFar [9];
  GLfloat verticesPost [12];
  GLfloat samplePos [2];
  IndexType local_890 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_888 [23];
  ProgramSources sources1a;
  ShaderProgram program1a;
  ShaderProgram program2;
  ShaderProgram program1b;
  VertexArrayBinding vertexArraysPost [2];
  VertexArrayBinding vertexArraysFar [2];
  VertexArrayBinding vertexArraysNear [2];
  ProgramSources sources1b;
  GLfloat verticesNear [9];
  ProgramSources sources2;
  Functions *gl;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar5);
  texCoord[4] = 0.0;
  texCoord[5] = 1.0;
  texCoord[6] = 1.0;
  texCoord[7] = 1.0;
  texCoord[0] = 0.0;
  texCoord[1] = 0.0;
  texCoord[2] = 1.0;
  texCoord[3] = 0.0;
  verticesNear[4] = -1.0;
  verticesNear[5] = 0.25;
  verticesNear[6] = -1.0;
  verticesNear[7] = 0.4;
  verticesNear[0] = -1.0;
  verticesNear[1] = -1.0;
  verticesNear[2] = 0.25;
  verticesNear[3] = 0.4;
  verticesNear[8] = 0.25;
  verticesFar[4] = -1.0;
  verticesFar[5] = 0.75;
  verticesFar[6] = -1.0;
  verticesFar[7] = 3.0;
  verticesFar[0] = -1.0;
  verticesFar[1] = -1.0;
  verticesFar[2] = 0.75;
  verticesFar[3] = 3.0;
  verticesFar[8] = 0.75;
  verticesPost[8] = 0.0;
  verticesPost[9] = 1.0;
  verticesPost[10] = 1.0;
  verticesPost[0xb] = 0.0;
  verticesPost[4] = -1.0;
  verticesPost[5] = 0.0;
  verticesPost[6] = -1.0;
  verticesPost[7] = 1.0;
  verticesPost[0] = -1.0;
  verticesPost[1] = -1.0;
  verticesPost[2] = 0.0;
  verticesPost[3] = 1.0;
  indicesPre[0] = 0;
  indicesPre[1] = 1;
  indicesPre[2] = 2;
  indicesPost[4] = 2;
  indicesPost[5] = 3;
  indicesPost[0] = 0;
  indicesPost[1] = 1;
  indicesPost[2] = 2;
  indicesPost[3] = 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)samplePos,"vertex",(allocator<char> *)&program1a);
  glu::va::Float(vertexArraysNear,(string *)samplePos,3,3,0,verticesNear);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sources1a,"inTexCoord",(allocator<char> *)&sources1b);
  glu::va::Float(vertexArraysNear + 1,(string *)&sources1a,2,3,0,texCoord);
  std::__cxx11::string::~string((string *)&sources1a);
  std::__cxx11::string::~string((string *)samplePos);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)samplePos,"vertex",(allocator<char> *)&program1a);
  glu::va::Float(vertexArraysFar,(string *)samplePos,3,3,0,verticesFar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sources1a,"inTexCoord",(allocator<char> *)&sources1b);
  glu::va::Float(vertexArraysFar + 1,(string *)&sources1a,2,3,0,texCoord);
  std::__cxx11::string::~string((string *)&sources1a);
  std::__cxx11::string::~string((string *)samplePos);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)samplePos,"vertex",(allocator<char> *)&program1a);
  glu::va::Float(vertexArraysPost,(string *)samplePos,3,4,0,verticesPost);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sources1a,"inTexCoord",(allocator<char> *)&sources1b);
  glu::va::Float(vertexArraysPost + 1,(string *)&sources1a,2,4,0,texCoord);
  std::__cxx11::string::~string((string *)&sources1a);
  std::__cxx11::string::~string((string *)samplePos);
  vertexSrc = &this->m_vertShader;
  glu::makeVtxFragSources(&sources1a,vertexSrc,&this->m_fragShader1a);
  glu::ShaderProgram::ShaderProgram(&program1a,gl,&sources1a);
  if (program1a.m_program.m_info.linkOk == false) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Shader program fail (non post_depth_coverage).");
    samplePos = (GLfloat  [2])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_890);
    std::operator<<((ostream *)local_890,"Vertex: ");
    std::operator<<((ostream *)local_890,
                    (string *)
                    &((*program1a.m_shaders[0].
                        super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                        super__Vector_impl_data._M_start)->m_info).infoLog);
    std::operator<<((ostream *)local_890,"\n");
    std::operator<<((ostream *)local_890,"Fragment: ");
    std::operator<<((ostream *)local_890,
                    (string *)
                    &((*program1a.m_shaders[1].
                        super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                        super__Vector_impl_data._M_start)->m_info).infoLog);
    std::operator<<((ostream *)local_890,"\n");
    std::operator<<((ostream *)local_890,"Program: ");
    std::operator<<((ostream *)local_890,(string *)&program1a.m_program.m_info);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)samplePos,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_890);
  }
  else {
    glu::makeVtxFragSources(&sources1b,vertexSrc,&this->m_fragShader1b);
    glu::ShaderProgram::ShaderProgram(&program1b,gl,&sources1b);
    if (program1b.m_program.m_info.linkOk == false) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Shader program fail (post_depth_coverage).");
      samplePos = (GLfloat  [2])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_890);
      std::operator<<((ostream *)local_890,"PostDepthCoverage: enabled\n");
      std::operator<<((ostream *)local_890,"Vertex: ");
      std::operator<<((ostream *)local_890,
                      (string *)
                      &((*program1b.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_start)->m_info).infoLog);
      std::operator<<((ostream *)local_890,"\n");
      std::operator<<((ostream *)local_890,"Fragment: ");
      std::operator<<((ostream *)local_890,
                      (string *)
                      &((*program1b.m_shaders[1].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_start)->m_info).infoLog);
      std::operator<<((ostream *)local_890,"\n");
      std::operator<<((ostream *)local_890,"Program: ");
      std::operator<<((ostream *)local_890,(string *)&program1b.m_program.m_info);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)samplePos,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_890);
    }
    else {
      glu::makeVtxFragSources(&sources2,vertexSrc,&this->m_fragShader2);
      glu::ShaderProgram::ShaderProgram(&program2,gl,&sources2);
      if (program2.m_program.m_info.linkOk == false) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Shader program fail (samples reader).");
        samplePos = (GLfloat  [2])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_890);
        std::operator<<((ostream *)local_890,"Vertex: ");
        std::operator<<((ostream *)local_890,
                        (string *)
                        &((*program2.m_shaders[0].
                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                            _M_impl.super__Vector_impl_data._M_start)->m_info).infoLog);
        std::operator<<((ostream *)local_890,"\n");
        std::operator<<((ostream *)local_890,"Fragment: ");
        std::operator<<((ostream *)local_890,
                        (string *)
                        &((*program2.m_shaders[1].
                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                            _M_impl.super__Vector_impl_data._M_start)->m_info).infoLog);
        std::operator<<((ostream *)local_890,"\n");
        std::operator<<((ostream *)local_890,"Program: ");
        std::operator<<((ostream *)local_890,(string *)&program2.m_program.m_info);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)samplePos,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00ae120f:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_890);
      }
      else {
        (*gl->clearColor)(0.0,0.0,0.0,0.0);
        (*gl->clearStencil)(0);
        for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
          GVar10 = 0xb90;
          if (iVar5 == 0) {
            GVar10 = 0xb71;
          }
          for (iVar12 = 0; iVar12 != 2; iVar12 = iVar12 + 1) {
            pSVar8 = &program1b;
            if (iVar12 == 0) {
              pSVar8 = &program1a;
            }
            program = (pSVar8->m_program).m_program;
            (*gl->useProgram)(program);
            (*gl->bindFramebuffer)(0x8d40,this->m_framebufferMS);
            (*gl->viewport)(0,0,1,1);
            (*gl->enable)(0x809d);
            for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
              (*gl->getMultisamplefv)(0x8e50,(GLuint)lVar14,samplePos);
              GVar6 = (*gl->getError)();
              glu::checkError(GVar6,"glGetMultisamplefv",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPostDepthCoverageTests.cpp"
                              ,0x1aa);
              if ((iVar12 != 1) || (0.7 <= samplePos[0] + samplePos[1])) {
                GVar4 = '\x01';
              }
              else {
                GVar4 = '\0';
              }
              expectedMask[lVar14] = GVar4;
            }
            (*gl->enable)(GVar10);
            (*gl->clear)(0x4500);
            if (iVar5 == 1) {
              (*gl->stencilFunc)(0x207,1,0xff);
              (*gl->stencilOp)(0,0x1e01,0x1e01);
              (*gl->stencilMask)(0xff);
            }
            samplePos[0] = 1.4013e-45;
            samplePos[1] = 4.2039e-45;
            local_890[0] = INDEXTYPE_UINT32;
            local_888[0]._0_8_ = indicesPre;
            glu::draw(((this->super_TestCase).m_context)->m_renderCtx,program,2,vertexArraysNear,
                      (PrimitiveList *)samplePos,(DrawUtilCallback *)0x0);
            (*gl->clear)(0x4000);
            if (iVar5 == 1) {
              (*gl->stencilFunc)(0x205,1,0xff);
              (*gl->stencilMask)(0);
            }
            samplePos[0] = 1.4013e-45;
            samplePos[1] = 4.2039e-45;
            local_890[0] = INDEXTYPE_UINT32;
            local_888[0]._0_8_ = indicesPre;
            glu::draw(((this->super_TestCase).m_context)->m_renderCtx,program,2,vertexArraysFar,
                      (PrimitiveList *)samplePos,(DrawUtilCallback *)0x0);
            (*gl->disable)(0xb71);
            (*gl->disable)(GVar10);
            (*gl->bindFramebuffer)(0x8d40,0);
            (*gl->useProgram)(program2.m_program.m_program);
            (*gl->bindFramebuffer)(0x8d40,this->m_framebuffer);
            (*gl->viewport)(0,0,1,4);
            (*gl->activeTexture)(0x84c0);
            (*gl->bindTexture)(0x9100,this->m_textureMS);
            p_Var3 = gl->uniform1i;
            GVar7 = (*gl->getUniformLocation)(program2.m_program.m_program,"texture");
            (*p_Var3)(GVar7,0);
            (*gl->clear)(0x4500);
            samplePos = (GLfloat  [2])&DAT_600000001;
            local_890[0] = INDEXTYPE_UINT32;
            local_888[0]._0_8_ = indicesPost;
            glu::draw(((this->super_TestCase).m_context)->m_renderCtx,program2.m_program.m_program,2
                      ,vertexArraysPost,(PrimitiveList *)samplePos,(DrawUtilCallback *)0x0);
            (*gl->disable)(0x809d);
            pixels[0] = '\0';
            pixels[1] = '\0';
            pixels[2] = '\0';
            pixels[3] = '\0';
            pixels[4] = '\0';
            pixels[5] = '\0';
            pixels[6] = '\0';
            pixels[7] = '\0';
            pixels[8] = '\0';
            pixels[9] = '\0';
            pixels[10] = '\0';
            pixels[0xb] = '\0';
            pixels[0xc] = '\0';
            pixels[0xd] = '\0';
            pixels[0xe] = '\0';
            pixels[0xf] = '\0';
            (*gl->readPixels)(0,0,1,4,0x1908,0x1401,pixels);
            GVar6 = (*gl->getError)();
            glu::checkError(GVar6,"glReadPixels",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPostDepthCoverageTests.cpp"
                            ,0x1ee);
            compiledMask[0] = '\0';
            compiledMask[1] = '\0';
            compiledMask[2] = '\0';
            compiledMask[3] = '\0';
            pGVar9 = pixels;
            for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
              for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
                bVar15 = true;
                if (compiledMask[lVar11] == '\0') {
                  bVar15 = pGVar9[lVar11] != '\0';
                }
                compiledMask[lVar11] = bVar15;
              }
              pGVar9 = pGVar9 + 4;
            }
            lVar14 = 0;
            while (lVar14 != 4) {
              pGVar1 = expectedMask + lVar14;
              pGVar2 = compiledMask + lVar14;
              lVar14 = lVar14 + 1;
              if (*pGVar1 != *pGVar2) {
                tcu::TestContext::setTestResult
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                           QP_TEST_RESULT_FAIL,"Fail");
                samplePos = (GLfloat  [2])
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_890);
                std::operator<<((ostream *)local_890,"Wrong results for ");
                pcVar13 = "BUFFERCASE_DEPTH_STENCIL";
                if (iVar5 == 0) {
                  pcVar13 = "BUFFERCASE_DEPTH";
                }
                std::operator<<((ostream *)local_890,pcVar13);
                std::operator<<((ostream *)local_890," / ");
                pcVar13 = "PDCCASE_ENABLED";
                if (iVar12 == 0) {
                  pcVar13 = "PDCCASE_DISABLED";
                }
                std::operator<<((ostream *)local_890,pcVar13);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)samplePos,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                goto LAB_00ae120f;
              }
            }
          }
        }
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      glu::ShaderProgram::~ShaderProgram(&program2);
      glu::ProgramSources::~ProgramSources(&sources2);
    }
    glu::ShaderProgram::~ShaderProgram(&program1b);
    glu::ProgramSources::~ProgramSources(&sources1b);
  }
  glu::ShaderProgram::~ShaderProgram(&program1a);
  glu::ProgramSources::~ProgramSources(&sources1a);
  lVar14 = 0x58;
  do {
    std::__cxx11::string::~string((string *)((long)&vertexArraysPost[0].binding.type + lVar14));
    lVar14 = lVar14 + -0x50;
  } while (lVar14 != -0x48);
  lVar14 = 0x58;
  do {
    std::__cxx11::string::~string((string *)((long)&vertexArraysFar[0].binding.type + lVar14));
    lVar14 = lVar14 + -0x50;
  } while (lVar14 != -0x48);
  lVar14 = 0x58;
  do {
    std::__cxx11::string::~string((string *)((long)&vertexArraysNear[0].binding.type + lVar14));
    lVar14 = lVar14 + -0x50;
  } while (lVar14 != -0x48);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult PostDepthSampleMaskCase::iterate()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	const GLfloat texCoord[] = {
		0.0f, 0.0f, 1.0f, 0.0f, 0.0f, 1.0f, 1.0f, 1.0f,
	};

	const GLfloat verticesNear[] = {
		-1.0f, -1.0f, 0.25f, 0.4f, -1.0f, 0.25f, -1.0f, 0.4f, 0.25f,
	};

	const GLfloat verticesFar[] = {
		-1.0f, -1.0f, 0.75f, 3.0f, -1.0f, 0.75f, -1.0f, 3.0f, 0.75f,
	};

	const GLfloat verticesPost[] = {
		-1.0f, -1.0f, 0.0f, 1.0f, -1.0f, 0.0f, -1.0f, 1.0f, 0.0f, 1.0f, 1.0f, 0.0f,
	};

	const GLuint indicesPre[] = { 0, 1, 2 };

	const GLuint indicesPost[] = { 0, 1, 2, 1, 2, 3 };

	glu::VertexArrayBinding vertexArraysNear[] = { glu::va::Float("vertex", 3, 3, 0, verticesNear),
												   glu::va::Float("inTexCoord", 2, 3, 0, texCoord) };

	glu::VertexArrayBinding vertexArraysFar[] = { glu::va::Float("vertex", 3, 3, 0, verticesFar),
												  glu::va::Float("inTexCoord", 2, 3, 0, texCoord) };

	glu::VertexArrayBinding vertexArraysPost[] = { glu::va::Float("vertex", 3, 4, 0, verticesPost),
												   glu::va::Float("inTexCoord", 2, 4, 0, texCoord) };

	//Prepare shaders
	ProgramSources sources1a = makeVtxFragSources(m_vertShader, m_fragShader1a);
	ShaderProgram  program1a(gl, sources1a);

	if (!program1a.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader program fail (non post_depth_coverage).");
		m_testCtx.getLog() << tcu::TestLog::Message << "Vertex: " << program1a.getShaderInfo(SHADERTYPE_VERTEX).infoLog
						   << "\n"
						   << "Fragment: " << program1a.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog << "\n"
						   << "Program: " << program1a.getProgramInfo().infoLog << tcu::TestLog::EndMessage;
		return STOP;
	}

	ProgramSources sources1b = makeVtxFragSources(m_vertShader, m_fragShader1b);
	ShaderProgram  program1b(gl, sources1b);

	if (!program1b.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader program fail (post_depth_coverage).");
		m_testCtx.getLog() << tcu::TestLog::Message << "PostDepthCoverage: enabled\n"
						   << "Vertex: " << program1b.getShaderInfo(SHADERTYPE_VERTEX).infoLog << "\n"
						   << "Fragment: " << program1b.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog << "\n"
						   << "Program: " << program1b.getProgramInfo().infoLog << tcu::TestLog::EndMessage;
		return STOP;
	}

	ProgramSources sources2 = makeVtxFragSources(m_vertShader, m_fragShader2);
	ShaderProgram  program2(gl, sources2);

	if (!program2.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader program fail (samples reader).");
		m_testCtx.getLog() << tcu::TestLog::Message << "Vertex: " << program2.getShaderInfo(SHADERTYPE_VERTEX).infoLog
						   << "\n"
						   << "Fragment: " << program2.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog << "\n"
						   << "Program: " << program2.getProgramInfo().infoLog << tcu::TestLog::EndMessage;
		return STOP;
	}

	gl.clearColor(0.0f, 0.0f, 0.0f, 0.0f);
	gl.clearStencil(0);

	//Iterate through all cases
	for (int bufferCase = BUFFERCASE_FIRST; bufferCase <= BUFFERCASE_LAST; ++bufferCase)
		for (int pdcCase = PDCCASE_FIRST; pdcCase <= PDCCASE_LAST; ++pdcCase)
		{
			GLint program = 0;
			if (pdcCase == PDCCASE_DISABLED)
				program = program1a.getProgram();
			else if (pdcCase == PDCCASE_ENABLED)
				program = program1b.getProgram();

			gl.useProgram(program);

			//Firstible use multisampled framebuffer
			gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebufferMS);
			gl.viewport(0, 0, 1, 1);

			gl.enable(GL_MULTISAMPLE);

			//Check which samples should be covered by first draw - calculate expected sample mask
			GLboolean expectedMask[4];

			for (GLint i = 0; i < 4; ++i)
			{
				GLfloat samplePos[2];
				gl.getMultisamplefv(GL_SAMPLE_POSITION, i, &samplePos[0]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetMultisamplefv");
				if (pdcCase == PDCCASE_ENABLED && (samplePos[0] + samplePos[1]) < 0.7f)
					expectedMask[i] = false;
				else
					expectedMask[i] = true;
			}

			if (bufferCase == BUFFERCASE_DEPTH)
				gl.enable(GL_DEPTH_TEST);
			else if (bufferCase == BUFFERCASE_STENCIL)
				gl.enable(GL_STENCIL_TEST);

			gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);

			if (bufferCase == BUFFERCASE_STENCIL)
			{
				gl.stencilFunc(GL_ALWAYS, 1, 0xFF);
				gl.stencilOp(GL_ZERO, GL_REPLACE, GL_REPLACE);
				gl.stencilMask(0xFF);
			}

			//Draw near primitive
			glu::draw(m_context.getRenderContext(), program, DE_LENGTH_OF_ARRAY(vertexArraysNear), vertexArraysNear,
					  glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(indicesPre), indicesPre));

			gl.clear(GL_COLOR_BUFFER_BIT);

			if (bufferCase == BUFFERCASE_STENCIL)
			{
				gl.stencilFunc(GL_NOTEQUAL, 1, 0xFF);
				gl.stencilMask(0x00);
			}

			//Draw far primitive
			glu::draw(m_context.getRenderContext(), program, DE_LENGTH_OF_ARRAY(vertexArraysFar), vertexArraysFar,
					  glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(indicesPre), indicesPre));

			gl.disable(GL_DEPTH_TEST);
			if (bufferCase == BUFFERCASE_DEPTH)
				gl.disable(GL_DEPTH_TEST);
			else if (bufferCase == BUFFERCASE_STENCIL)
				gl.disable(GL_STENCIL_TEST);

			gl.bindFramebuffer(GL_FRAMEBUFFER, 0);

			gl.useProgram(program2.getProgram());

			gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);
			gl.viewport(0, 0, 1, 4);

			//Pass multisampled texture as a uniform
			gl.activeTexture(GL_TEXTURE0);
			gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, m_textureMS);
			gl.uniform1i(gl.getUniformLocation(program2.getProgram(), "texture"), 0);

			gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);

			//Draw multisampled texture to framebuffer
			glu::draw(m_context.getRenderContext(), program2.getProgram(), DE_LENGTH_OF_ARRAY(vertexArraysPost),
					  vertexArraysPost, glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(indicesPost), indicesPost));

			gl.disable(GL_MULTISAMPLE);

			//Read data from framebuffer
			GLubyte pixels[4 * 4];
			deMemset(pixels, 0, 4 * 4);

			gl.readPixels(0, 0, 1, 4, GL_RGBA, GL_UNSIGNED_BYTE, pixels);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels");

			//Verify the result
			GLboolean compiledMask[4];
			deMemset(compiledMask, 0, 4);
			for (int i = 0; i < 4; ++i)
			{
				for (int n			= 0; n < 4; ++n)
					compiledMask[n] = compiledMask[n] || (pixels[4 * i + n] != 0);
			}

			for (int n = 0; n < 4; ++n)
			{
				if (expectedMask[n] != compiledMask[n])
				{
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
					m_testCtx.getLog() << tcu::TestLog::Message << "Wrong results for "
									   << (bufferCase == BUFFERCASE_DEPTH ? "BUFFERCASE_DEPTH" :
																			"BUFFERCASE_DEPTH_STENCIL")
									   << " / "
									   << (pdcCase == PDCCASE_DISABLED ? "PDCCASE_DISABLED" : "PDCCASE_ENABLED")
									   << tcu::TestLog::EndMessage;
					return STOP;
				}
			}
		}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}